

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::OutStringStream::OutStringStream(OutStringStream *this)

{
  std::ios::ios((ios *)&(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = (_func_int **)0x115538;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0 =
       0x115560;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x78 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x79 = 0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x81 = 0;
  *(undefined1 **)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xa0;
  *(undefined8 *)
   &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x98 = 0;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xa0 = 0;
  return;
}

Assistant:

OutStringStream::OutStringStream()
    : std::ostringstream(), buffer(0), index(0), bufferSize(0), full(false) {
  dgDEBUGINOUT(15);
}